

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

UnknownFieldSet * __thiscall
google::protobuf::internal::InternalMetadata::
mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(InternalMetadata *this)

{
  ulong uVar1;
  Arena *arena;
  Container<google::protobuf::UnknownFieldSet> *pCVar2;
  intptr_t message_owned_arena_tag;
  Container<google::protobuf::UnknownFieldSet> *container;
  Arena *my_arena;
  InternalMetadata *this_local;
  
  arena = InternalMetadata::arena(this);
  pCVar2 = Arena::
           Create<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                     (arena);
  uVar1 = this->ptr_;
  this->ptr_ = (intptr_t)pCVar2;
  this->ptr_ = uVar1 & 2 | 1 | this->ptr_;
  (pCVar2->super_ContainerBase).arena = arena;
  return &pCVar2->unknown_fields;
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container<T>* container = Arena::Create<Container<T>>(my_arena);
    intptr_t message_owned_arena_tag = ptr_ & kMessageOwnedArenaTagMask;
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = reinterpret_cast<intptr_t>(container);
    ptr_ |= kUnknownFieldsTagMask | message_owned_arena_tag;
    container->arena = my_arena;
    return &(container->unknown_fields);
  }